

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp
# Opt level: O0

void __thiscall
glcts::ValidInternalformatAndSamplesValuesAreAcceptedTest::initInternals
          (ValidInternalformatAndSamplesValuesAreAcceptedTest *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  ValidInternalformatAndSamplesValuesAreAcceptedTest *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->to_id);
  (**(code **)(lVar3 + 0xb8))(0x9102,this->to_id);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Texture object initialization failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage3DMultisampleTests.cpp"
                  ,0x47f);
  return;
}

Assistant:

void ValidInternalformatAndSamplesValuesAreAcceptedTest::initInternals()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate texture object id. */
	gl.genTextures(1, &to_id);

	/* Bind generated texture object ID to GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES texture target. */
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture object initialization failed.");
}